

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

IDiagObjectAddress * __thiscall
Js::VariableWalkerBase::FindPropertyAddress
          (VariableWalkerBase *this,PropertyId propId,bool *isConst)

{
  Type pDVar1;
  bool bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  Type *ppDVar7;
  undefined4 extraout_var;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  uint index;
  IDiagObjectAddress *local_48;
  
  (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[4])();
  if (this->pMembersList !=
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    this_00 = this->pMembersList;
    iVar5 = (this_00->
            super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    bVar2 = 0 < iVar5;
    if (0 < iVar5) {
      index = 0;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        ppDVar7 = JsUtil::
                  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this_00,index);
        pDVar1 = *ppDVar7;
        if (pDVar1 == (Type)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x1c8,"(pair)","pair");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        if (pDVar1->propId == propId) {
          *isConst = (bool)((byte)pDVar1->flags & 1);
          iVar5 = (*(this->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[5])
                            (this,(ulong)index);
          local_48 = (IDiagObjectAddress *)CONCAT44(extraout_var,iVar5);
          break;
        }
        index = index + 1;
        this_00 = this->pMembersList;
        iVar5 = (this_00->
                super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
                ).count;
        bVar2 = (int)index < iVar5;
      } while ((int)index < iVar5);
    }
    if (bVar2) {
      return local_48;
    }
  }
  return (IDiagObjectAddress *)0x0;
}

Assistant:

IDiagObjectAddress *VariableWalkerBase::FindPropertyAddress(PropertyId propId, bool& isConst)
    {
        PopulateMembers();
        if (pMembersList)
        {
            for (int i = 0; i < pMembersList->Count(); i++)
            {
                DebuggerPropertyDisplayInfo *pair = pMembersList->Item(i);
                Assert(pair);
                if (pair->propId == propId)
                {
                    isConst = pair->IsConst();
                    return GetObjectAddress(i);
                }
            }
        }
        return nullptr;
    }